

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceD.cpp
# Opt level: O2

istream * operator>>(istream *in,SequenceD<64> *t_seq)

{
  Sequence SStack_78;
  
  read_seq_from_chars(&SStack_78,in,4);
  std::deque<int,_std::allocator<int>_>::_M_move_assign1
            (&(t_seq->super_Sequence).m_bits,&SStack_78.m_bits);
  Sequence::~Sequence(&SStack_78);
  read_seq_from_chars(&SStack_78,in,4);
  std::deque<int,_std::allocator<int>_>::_M_move_assign1(&(t_seq->m_other).m_bits,&SStack_78.m_bits)
  ;
  Sequence::~Sequence(&SStack_78);
  return in;
}

Assistant:

std::istream &operator>>(std::istream &in, SequenceD<64> &t_seq) {
    t_seq.left() = read_seq_from_chars(in, 4);
    t_seq.right() = read_seq_from_chars(in, 4);
    return in;
}